

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_pax.c
# Opt level: O0

void test_acl_pax(void)

{
  mode_t mVar1;
  archive *paVar2;
  archive_entry *entry;
  FILE *__stream;
  char *unaff_retaddr;
  void *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  size_t reference_size;
  void *reference;
  FILE *f;
  size_t used;
  archive_entry *ae;
  archive *a;
  char *in_stack_000003c0;
  archive_entry *in_stack_ffffffffffffffa8;
  void *extra;
  archive *a_00;
  archive_entry **entry_00;
  archive_entry *in_stack_ffffffffffffffb0;
  char *entry_01;
  archive *in_stack_ffffffffffffffb8;
  longlong v1;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc4;
  archive *in_stack_ffffffffffffffc8;
  size_t local_30;
  char *local_28;
  void *in_stack_ffffffffffffffe0;
  acl_t *in_stack_ffffffffffffffe8;
  acl_t *acls;
  
  paVar2 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_write_set_format_pax(in_stack_ffffffffffffffb8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_write_add_filter_none(paVar2);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_write_set_bytes_per_block
            (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_write_set_bytes_in_last_block
            (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_write_open_memory
            (in_stack_ffffffffffffffc8,
             (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (size_t)in_stack_ffffffffffffffb8,(size_t *)in_stack_ffffffffffffffb0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  entry = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_entry_set_pathname(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  archive_entry_set_mode(entry,0x81ff);
  set_acls(in_stack_ffffffffffffffb0,(acl_t *)in_stack_ffffffffffffffa8,0);
  archive_write_header((archive *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  set_acls(in_stack_ffffffffffffffb0,(acl_t *)in_stack_ffffffffffffffa8,0);
  archive_write_header((archive *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  set_acls(in_stack_ffffffffffffffb0,(acl_t *)in_stack_ffffffffffffffa8,0);
  archive_write_header((archive *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  set_acls(in_stack_ffffffffffffffb0,(acl_t *)in_stack_ffffffffffffffa8,0);
  archive_write_header((archive *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_entry_free((archive_entry *)0x121c1c);
  archive_write_close((archive *)0x121c26);
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                      (longlong)paVar2,(char *)0x121c55,in_stack_ffffffffffffffe0);
  archive_write_free((archive *)0x121c5f);
  extra = (void *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x121c8d,in_stack_ffffffffffffffe0);
  __stream = fopen("testout","wb");
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,extra);
  acls = in_stack_ffffffffffffffe8;
  fwrite(buff,1,(ulong)in_stack_ffffffffffffffe8 & 0xffffffff,__stream);
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x121d2c,__stream);
  fclose(__stream);
  extract_reference_file(in_stack_000003c0);
  local_28 = slurpfile(&local_30,"test_acl_pax.tar");
  failure(
         "Generated pax archive does not match reference; compare \'testout\' to \'test_acl_pax.tar\' reference file."
         );
  entry_01 = "reference_size";
  v1 = 0;
  assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,paVar2,
                      (char *)entry,(size_t)reference,(char *)f,(void *)used);
  failure(
         "Generated pax archive does not match reference; compare \'testout\' to \'test_acl_pax.tar\' reference file."
         );
  a_00 = (archive *)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffc4,v1,entry_01,0,
                      (char *)0x121df8,__stream);
  free(local_28);
  paVar2 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_read_support_format_all(a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_read_support_filter_all(a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_read_open_memory((archive *)entry_01,a_00,0x121eb9);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_read_next_header((archive *)entry_01,(archive_entry **)a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  archive_entry_acl_reset((archive_entry *)entry_01,(wchar_t)((ulong)a_00 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_read_next_header((archive *)entry_01,(archive_entry **)a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  failure("One extended ACL should flag all ACLs to be returned.");
  archive_entry_acl_reset((archive_entry *)entry_01,(wchar_t)((ulong)a_00 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  compare_acls(entry,acls,(int)((ulong)__stream >> 0x20),(int)__stream);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_read_next_header((archive *)entry_01,(archive_entry **)a_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,a_00);
  archive_entry_acl_reset((archive_entry *)entry_01,(wchar_t)((ulong)a_00 >> 0x20));
  entry_00 = (archive_entry **)0x0;
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffc4,v1,entry_01,0,
                      (char *)0x12212e,__stream);
  compare_acls(entry,acls,(int)((ulong)__stream >> 0x20),(int)__stream);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0543, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,entry_00);
  archive_read_next_header((archive *)entry_01,entry_00);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,entry_00);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  archive_entry_acl_reset((archive_entry *)entry_01,(wchar_t)((ulong)entry_00 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,entry_00);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,entry_01,entry_00);
  archive_read_close((archive *)0x122285);
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffc4,v1,entry_01,
                      (longlong)paVar2,(char *)0x1222b4,__stream);
  archive_read_free((archive *)0x1222be);
  assertion_equal_int((char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffc4,v1,entry_01,0,
                      (char *)0x1222ec,__stream);
  return;
}

Assistant:

DEFINE_TEST(test_acl_pax)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t used;
	FILE *f;
	void *reference;
	size_t reference_size;

	/* Write an archive to memory. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Write a series of files to the archive with different ACL info. */

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* Basic owner/owning group should just update mode bits. */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	assertA(0 == archive_write_header(a, ae));

	/* With any extended ACL entry, we should read back a full set. */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	assertA(0 == archive_write_header(a, ae));


	/* A more extensive set of ACLs. */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	assertA(0 == archive_write_header(a, ae));

	/*
	 * Check that clearing ACLs gets rid of them all by repeating
	 * the first test.
	 */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Write out the data we generated to a file for manual inspection. */
	assert(NULL != (f = fopen("testout", "wb")));
	assertEqualInt(used, (size_t)fwrite(buff, 1, (unsigned int)used, f));
	fclose(f);

	/* Write out the reference data to a file for manual inspection. */
	extract_reference_file("test_acl_pax.tar");
	reference = slurpfile(&reference_size, "test_acl_pax.tar");

	/* Assert that the generated data matches the built-in reference data.*/
	failure("Generated pax archive does not match reference; compare 'testout' to 'test_acl_pax.tar' reference file.");
	assertEqualMem(buff, reference, reference_size);
	failure("Generated pax archive does not match reference; compare 'testout' to 'test_acl_pax.tar' reference file.");
	assertEqualInt((int)used, reference_size);
	free(reference);

	/* Read back each entry and check that the ACL data is right. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	/* First item has no ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Second item has a few ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("One extended ACL should flag all ACLs to be returned.");
	assert(4 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]), 0142);
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Third item has pretty extensive ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]), 0543);
	failure("Basic ACLs should set mode to 0543, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0543);

	/* Fourth item has no ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}